

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

void av1_find_cnn_layer_output_size
               (int in_width,int in_height,CNN_LAYER_CONFIG *layer_config,int *out_width,
               int *out_height)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = layer_config->pad;
  if (layer_config->deconvolve == 0) {
    if (bVar1 < 2) {
      *out_width = (in_width + layer_config->skip_width + -1) / layer_config->skip_width;
      iVar2 = (in_height + layer_config->skip_height + -1) / layer_config->skip_height;
    }
    else {
      if (bVar1 != 2) {
        return;
      }
      *out_width = ((in_width - layer_config->filter_width) + layer_config->skip_width) /
                   layer_config->skip_width;
      iVar2 = ((in_height - layer_config->filter_height) + layer_config->skip_height) /
              layer_config->skip_height;
    }
  }
  else if (bVar1 < 2) {
    *out_width = in_width * layer_config->skip_width;
    iVar2 = in_height * layer_config->skip_height;
  }
  else {
    if (bVar1 != 2) {
      return;
    }
    *out_width = (in_width + -1) * layer_config->skip_width + layer_config->filter_width;
    iVar2 = (in_height + -1) * layer_config->skip_height + layer_config->filter_height;
  }
  *out_height = iVar2;
  return;
}

Assistant:

void av1_find_cnn_layer_output_size(int in_width, int in_height,
                                    const CNN_LAYER_CONFIG *layer_config,
                                    int *out_width, int *out_height) {
  assert(layer_config->skip_width > 0);
  assert(layer_config->skip_height > 0);
  if (!layer_config->deconvolve) {
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
      case PADDING_SAME_REPLICATE:
        *out_width = (in_width + layer_config->skip_width - 1) /
                     layer_config->skip_width;
        *out_height = (in_height + layer_config->skip_height - 1) /
                      layer_config->skip_height;
        break;
      case PADDING_VALID:
        *out_width =
            (in_width - layer_config->filter_width + layer_config->skip_width) /
            layer_config->skip_width;
        *out_height = (in_height - layer_config->filter_height +
                       layer_config->skip_height) /
                      layer_config->skip_height;
        break;
      default: assert(0 && "Unknown padding type");
    }
  } else {
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
      case PADDING_SAME_REPLICATE:
        *out_width = in_width * layer_config->skip_width;
        *out_height = in_height * layer_config->skip_height;
        break;
      case PADDING_VALID:
        *out_width = (in_width - 1) * layer_config->skip_width +
                     layer_config->filter_width;
        *out_height = (in_height - 1) * layer_config->skip_height +
                      layer_config->filter_height;
        break;
      default: assert(0 && "Unknown padding type");
    }
  }
}